

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.cpp
# Opt level: O0

Uint64 Diligent::PinWorkerThread(Uint32 ThreadId,Uint64 AllowedCoresMask)

{
  undefined *puVar1;
  uint uVar2;
  Uint32 UVar3;
  undefined8 uVar4;
  Char *pCVar5;
  Uint64 UVar6;
  char (*in_RCX) [22];
  uint *in_R9;
  char (*in_stack_fffffffffffffed8) [17];
  code *pcVar7;
  undefined1 local_100 [8];
  string _msg_1;
  Uint64 PrevMask;
  string msg_2;
  undefined1 local_b0 [4];
  Uint32 WorkerCore;
  string msg_1;
  Uint64 LSB;
  string msg;
  Uint32 bit;
  Uint32 CoreBitInd;
  Uint32 NumAllowedCores;
  undefined1 local_50 [8];
  string _msg;
  Uint64 AffinityMask;
  Uint64 NumCores;
  Uint64 AllowedCoresMask_local;
  Uint64 UStack_10;
  Uint32 ThreadId_local;
  
  if (AllowedCoresMask == 0) {
    UStack_10 = 0;
  }
  else {
    NumCores = AllowedCoresMask;
    AllowedCoresMask_local._4_4_ = ThreadId;
    uVar2 = std::thread::hardware_concurrency();
    AffinityMask = (Uint64)uVar2;
    if (AffinityMask < (char (*) [22])0x2) {
      UStack_10 = 0;
    }
    else {
      _msg.field_2._8_8_ = NumCores;
      if (AffinityMask < (char (*) [22])0x40) {
        _msg.field_2._8_8_ = (1L << ((byte)uVar2 & 0x3f)) - 1U & NumCores;
        in_RCX = (char (*) [22])AffinityMask;
      }
      if (_msg.field_2._8_8_ == 0) {
        FormatString<char[23],std::ios_base&(std::ios_base&),unsigned_long,char[42],std::ios_base&(std::ios_base&),unsigned_long,char[17]>
                  ((string *)local_50,(Diligent *)"Allowed cores mask (0x",(char (*) [23])std::hex,
                   (_func_ios_base_ptr_ios_base_ptr *)&NumCores,
                   (unsigned_long *)") does not set any bits corresponding to ",
                   (char (*) [42])std::dec,(_func_ios_base_ptr_ios_base_ptr *)&AffinityMask,
                   (unsigned_long *)" available cores",in_stack_fffffffffffffed8);
        puVar1 = DebugMessageCallback;
        if (DebugMessageCallback != (undefined *)0x0) {
          uVar4 = std::__cxx11::string::c_str();
          (*(code *)puVar1)(1,uVar4,0);
        }
        std::__cxx11::string::~string((string *)local_50);
        UStack_10 = 0;
      }
      else {
        UVar3 = LinuxMisc::CountOneBits(_msg.field_2._8_8_);
        msg.field_2._12_4_ = AllowedCoresMask_local._4_4_ % UVar3;
        for (msg.field_2._8_4_ = 0; (uint)msg.field_2._8_4_ < (uint)msg.field_2._12_4_;
            msg.field_2._8_4_ = msg.field_2._8_4_ + 1) {
          if (_msg.field_2._8_8_ == 0) {
            FormatString<char[26],char[18]>
                      ((string *)&LSB,(Diligent *)"Debug expression failed:\n",
                       (char (*) [26])"AffinityMask != 0",(char (*) [18])in_RCX);
            pCVar5 = (Char *)std::__cxx11::string::c_str();
            DebugAssertionFailed
                      (pCVar5,"PinWorkerThread",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/src/ThreadPool.cpp"
                       ,0x17d);
            std::__cxx11::string::~string((string *)&LSB);
          }
          UVar3 = LinuxMisc::GetLSB(_msg.field_2._8_8_);
          in_RCX = (char (*) [22])(ulong)UVar3;
          _msg.field_2._8_8_ =
               (1L << ((byte)UVar3 & 0x3f) ^ 0xffffffffffffffffU) & _msg.field_2._8_8_;
          msg_1.field_2._8_8_ = in_RCX;
        }
        if (_msg.field_2._8_8_ == 0) {
          FormatString<char[26],char[18]>
                    ((string *)local_b0,(Diligent *)"Debug expression failed:\n",
                     (char (*) [26])"AffinityMask != 0",(char (*) [18])in_RCX);
          pCVar5 = (Char *)std::__cxx11::string::c_str();
          in_RCX = (char (*) [22])0x182;
          DebugAssertionFailed
                    (pCVar5,"PinWorkerThread",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/src/ThreadPool.cpp"
                     ,0x182);
          std::__cxx11::string::~string((string *)local_b0);
        }
        msg_2.field_2._12_4_ = LinuxMisc::GetLSB(_msg.field_2._8_8_);
        if (AffinityMask <= (uint)msg_2.field_2._12_4_) {
          FormatString<char[26],char[22]>
                    ((string *)&PrevMask,(Diligent *)"Debug expression failed:\n",
                     (char (*) [26])"WorkerCore < NumCores",in_RCX);
          pCVar5 = (Char *)std::__cxx11::string::c_str();
          DebugAssertionFailed
                    (pCVar5,"PinWorkerThread",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/src/ThreadPool.cpp"
                     ,0x184);
          std::__cxx11::string::~string((string *)&PrevMask);
        }
        UVar6 = LinuxMisc::SetCurrentThreadAffinity(1L << ((byte)msg_2.field_2._12_4_ & 0x3f));
        _msg_1.field_2._8_8_ = ZEXT18(UVar6 != 0);
        if (_msg_1.field_2._8_8_ == 0) {
          FormatString<char[29],unsigned_int,char[10],unsigned_int>
                    ((string *)local_100,(Diligent *)"Failed to pin worker thread ",
                     (char (*) [29])((long)&AllowedCoresMask_local + 4),(uint *)" to core ",
                     (char (*) [10])((long)&msg_2.field_2 + 0xc),in_R9);
          if (DebugMessageCallback != (undefined *)0x0) {
            pcVar7 = (code *)DebugMessageCallback;
            uVar4 = std::__cxx11::string::c_str();
            (*pcVar7)(1,uVar4,0);
          }
          std::__cxx11::string::~string((string *)local_100);
        }
        UStack_10 = _msg_1.field_2._8_8_;
      }
    }
  }
  return UStack_10;
}

Assistant:

Uint64 PinWorkerThread(Uint32 ThreadId, Uint64 AllowedCoresMask)
{
    if (AllowedCoresMask == 0)
    {
        return 0;
    }

    Uint64 NumCores = std::thread::hardware_concurrency();
    if (NumCores <= 1)
        return 0;

    Uint64 AffinityMask = AllowedCoresMask;
    if (NumCores < 64)
        AffinityMask &= (Uint64{1} << NumCores) - Uint64{1};

    if (AffinityMask == 0)
    {
        LOG_WARNING_MESSAGE("Allowed cores mask (0x", std::hex, AllowedCoresMask, ") does not set any bits corresponding to ", std::dec, NumCores, " available cores");
        return 0;
    }

    const Uint32 NumAllowedCores = PlatformMisc::CountOneBits(AffinityMask);
    const Uint32 CoreBitInd      = ThreadId % NumAllowedCores;

    for (Uint32 bit = 0; bit < CoreBitInd; ++bit)
    {
        VERIFY_EXPR(AffinityMask != 0);
        Uint64 LSB = PlatformMisc::GetLSB(AffinityMask);
        AffinityMask &= ~(Uint64{1} << LSB);
    }

    VERIFY_EXPR(AffinityMask != 0);
    Uint32 WorkerCore = PlatformMisc::GetLSB(AffinityMask);
    VERIFY_EXPR(WorkerCore < NumCores);
    Uint64 PrevMask = PlatformMisc::SetCurrentThreadAffinity(Uint64{1} << WorkerCore) != 0;
    if (PrevMask == 0)
    {
        LOG_WARNING_MESSAGE("Failed to pin worker thread ", ThreadId, " to core ", WorkerCore);
    }

    return PrevMask;
}